

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.hpp
# Opt level: O2

void __thiscall camp::OutOfRange::OutOfRange(OutOfRange *this,OutOfRange *param_1)

{
  Error::Error(&this->super_Error,&param_1->super_Error);
  *(undefined ***)&this->super_Error = &PTR__Error_00141238;
  return;
}

Assistant:

class CAMP_API OutOfRange : public Error
{
public:

    /**
     * \brief Constructor
     *
     * \param index Invalid index
     * \param size Allowed size
     */
    OutOfRange(std::size_t index, std::size_t size);
}